

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ze_ldrddi.cpp
# Opt level: O3

ze_result_t
zeGetRTASParallelOperationExpProcAddrTable
          (ze_api_version_t version,ze_rtas_parallel_operation_exp_dditable_t *pDdiTable)

{
  undefined8 *puVar1;
  long lVar2;
  ze_pfnRTASParallelOperationCreateExp_t p_Var3;
  ze_pfnRTASParallelOperationGetPropertiesExp_t p_Var4;
  ze_pfnRTASParallelOperationDestroyExp_t p_Var5;
  ze_result_t zVar6;
  code *pcVar7;
  iterator __begin1;
  undefined8 *puVar8;
  ze_rtas_parallel_operation_exp_dditable_t dditable;
  undefined4 local_58;
  undefined4 uStack_54;
  undefined4 uStack_50;
  undefined4 uStack_4c;
  undefined4 local_48;
  undefined4 uStack_44;
  undefined4 uStack_40;
  undefined4 uStack_3c;
  
  puVar8 = *(undefined8 **)(loader::context + 0x15e0);
  puVar1 = *(undefined8 **)(loader::context + 0x15e8);
  if (puVar1 == puVar8) {
LAB_001abd7c:
    zVar6 = ZE_RESULT_ERROR_UNINITIALIZED;
  }
  else {
    if (pDdiTable == (ze_rtas_parallel_operation_exp_dditable_t *)0x0) {
      return ZE_RESULT_ERROR_INVALID_NULL_POINTER;
    }
    if (*(int *)(loader::context + 0x15c0) < (int)version) {
      return ZE_RESULT_ERROR_UNSUPPORTED_VERSION;
    }
    zVar6 = ZE_RESULT_SUCCESS;
    do {
      if ((*(int *)(puVar8 + 1) == 0) &&
         (pcVar7 = (code *)dlsym(*puVar8,"zeGetRTASParallelOperationExpProcAddrTable"),
         pcVar7 != (code *)0x0)) {
        zVar6 = (*pcVar7)(version,puVar8 + 0x10);
      }
      puVar8 = puVar8 + 0x1b3;
    } while (puVar8 != puVar1);
    if (zVar6 != ZE_RESULT_SUCCESS) {
      return zVar6;
    }
    lVar2 = *(long *)(loader::context + 0x15e0);
    if (((ulong)((*(long *)(loader::context + 0x15e8) - lVar2 >> 3) * 0x7aff6957aff6957b) < 2) &&
       (*(char *)(loader::context + 0x1629) != '\x01')) {
      p_Var3 = *(ze_pfnRTASParallelOperationCreateExp_t *)(lVar2 + 0x80);
      p_Var4 = *(ze_pfnRTASParallelOperationGetPropertiesExp_t *)(lVar2 + 0x88);
      p_Var5 = *(ze_pfnRTASParallelOperationDestroyExp_t *)(lVar2 + 0x98);
      pDdiTable->pfnJoinExp = *(ze_pfnRTASParallelOperationJoinExp_t *)(lVar2 + 0x90);
      pDdiTable->pfnDestroyExp = p_Var5;
      pDdiTable->pfnCreateExp = p_Var3;
      pDdiTable->pfnGetPropertiesExp = p_Var4;
    }
    else {
      pDdiTable->pfnCreateExp = loader::zeRTASParallelOperationCreateExp;
      pDdiTable->pfnGetPropertiesExp = loader::zeRTASParallelOperationGetPropertiesExp;
      pDdiTable->pfnJoinExp = loader::zeRTASParallelOperationJoinExp;
      pDdiTable->pfnDestroyExp = loader::zeRTASParallelOperationDestroyExp;
    }
    if (*(long *)(loader::context + 0x1618) != 0) {
      pcVar7 = (code *)dlsym(*(long *)(loader::context + 0x1618),
                             "zeGetRTASParallelOperationExpProcAddrTable");
      if (pcVar7 == (code *)0x0) goto LAB_001abd7c;
      zVar6 = (*pcVar7)(version,pDdiTable);
      if (zVar6 != ZE_RESULT_SUCCESS) {
        return zVar6;
      }
    }
    if (*(long *)(loader::context + 0x1620) == 0) {
      zVar6 = ZE_RESULT_SUCCESS;
    }
    else {
      pcVar7 = (code *)dlsym(*(long *)(loader::context + 0x1620),
                             "zeGetRTASParallelOperationExpProcAddrTable");
      zVar6 = ZE_RESULT_ERROR_UNINITIALIZED;
      if (pcVar7 != (code *)0x0) {
        local_58 = *(undefined4 *)&pDdiTable->pfnCreateExp;
        uStack_54 = *(undefined4 *)((long)&pDdiTable->pfnCreateExp + 4);
        uStack_50 = *(undefined4 *)&pDdiTable->pfnGetPropertiesExp;
        uStack_4c = *(undefined4 *)((long)&pDdiTable->pfnGetPropertiesExp + 4);
        local_48 = *(undefined4 *)&pDdiTable->pfnJoinExp;
        uStack_44 = *(undefined4 *)((long)&pDdiTable->pfnJoinExp + 4);
        uStack_40 = *(undefined4 *)&pDdiTable->pfnDestroyExp;
        uStack_3c = *(undefined4 *)((long)&pDdiTable->pfnDestroyExp + 4);
        zVar6 = (*pcVar7)(version,&local_58);
        lVar2 = loader::context;
        *(undefined4 *)(loader::context + 0x16c8) = local_58;
        *(undefined4 *)(lVar2 + 0x16cc) = uStack_54;
        *(undefined4 *)(lVar2 + 0x16d0) = uStack_50;
        *(undefined4 *)(lVar2 + 0x16d4) = uStack_4c;
        *(undefined4 *)(lVar2 + 0x16d8) = local_48;
        *(undefined4 *)(lVar2 + 0x16dc) = uStack_44;
        *(undefined4 *)(lVar2 + 0x16e0) = uStack_40;
        *(undefined4 *)(lVar2 + 0x16e4) = uStack_3c;
        if (*(char *)(lVar2 + 0x1652) == '\x01') {
          zVar6 = (*pcVar7)(version,pDdiTable);
        }
      }
    }
  }
  return zVar6;
}

Assistant:

ZE_DLLEXPORT ze_result_t ZE_APICALL
zeGetRTASParallelOperationExpProcAddrTable(
    ze_api_version_t version,                       ///< [in] API version requested
    ze_rtas_parallel_operation_exp_dditable_t* pDdiTable///< [in,out] pointer to table of DDI function pointers
    )
{
    if( loader::context->zeDrivers.size() < 1 ) {
        return ZE_RESULT_ERROR_UNINITIALIZED;
    }

    if( nullptr == pDdiTable )
        return ZE_RESULT_ERROR_INVALID_NULL_POINTER;

    if( loader::context->version < version )
        return ZE_RESULT_ERROR_UNSUPPORTED_VERSION;

    ze_result_t result = ZE_RESULT_SUCCESS;

    // Load the device-driver DDI tables
    for( auto& drv : loader::context->zeDrivers )
    {
        if(drv.initStatus != ZE_RESULT_SUCCESS)
            continue;
        auto getTable = reinterpret_cast<ze_pfnGetRTASParallelOperationExpProcAddrTable_t>(
            GET_FUNCTION_PTR( drv.handle, "zeGetRTASParallelOperationExpProcAddrTable") );
        if(!getTable) 
            continue; 
        result = getTable( version, &drv.dditable.ze.RTASParallelOperationExp);
    }


    if( ZE_RESULT_SUCCESS == result )
    {
        if( ( loader::context->zeDrivers.size() > 1 ) || loader::context->forceIntercept )
        {
            // return pointers to loader's DDIs
            pDdiTable->pfnCreateExp                                = loader::zeRTASParallelOperationCreateExp;
            pDdiTable->pfnGetPropertiesExp                         = loader::zeRTASParallelOperationGetPropertiesExp;
            pDdiTable->pfnJoinExp                                  = loader::zeRTASParallelOperationJoinExp;
            pDdiTable->pfnDestroyExp                               = loader::zeRTASParallelOperationDestroyExp;
        }
        else
        {
            // return pointers directly to driver's DDIs
            *pDdiTable = loader::context->zeDrivers.front().dditable.ze.RTASParallelOperationExp;
        }
    }

    // If the validation layer is enabled, then intercept the loader's DDIs
    if(( ZE_RESULT_SUCCESS == result ) && ( nullptr != loader::context->validationLayer ))
    {
        auto getTable = reinterpret_cast<ze_pfnGetRTASParallelOperationExpProcAddrTable_t>(
            GET_FUNCTION_PTR(loader::context->validationLayer, "zeGetRTASParallelOperationExpProcAddrTable") );
        if(!getTable)
            return ZE_RESULT_ERROR_UNINITIALIZED;
        result = getTable( version, pDdiTable );
    }

    // If the API tracing layer is enabled, then intercept the loader's DDIs
    if(( ZE_RESULT_SUCCESS == result ) && ( nullptr != loader::context->tracingLayer ))
    {
        auto getTable = reinterpret_cast<ze_pfnGetRTASParallelOperationExpProcAddrTable_t>(
            GET_FUNCTION_PTR(loader::context->tracingLayer, "zeGetRTASParallelOperationExpProcAddrTable") );
        if(!getTable)
            return ZE_RESULT_ERROR_UNINITIALIZED;
        ze_rtas_parallel_operation_exp_dditable_t dditable;
        memcpy(&dditable, pDdiTable, sizeof(ze_rtas_parallel_operation_exp_dditable_t));
        result = getTable( version, &dditable );
        loader::context->tracing_dditable.ze.RTASParallelOperationExp = dditable;
        if ( loader::context->tracingLayerEnabled ) {
            result = getTable( version, pDdiTable );
        }
    }

    return result;
}